

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O1

void __thiscall HFSubConsumer::sub_reader(HFSubConsumer *this,zloop_t *loop)

{
  bool bVar1;
  zframe_t *f;
  _zframe_t *local_30;
  
  bVar1 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                    ((ConcurrentQueue<_zframe_t*,MyTraits> *)&this->framequeue,&this->replacetoken,
                     &local_30);
  if (bVar1) {
    do {
      zframe_destroy(&local_30);
      local_30 = (_zframe_t *)0x0;
      bVar1 = moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::try_dequeue<_zframe_t*>
                        ((ConcurrentQueue<_zframe_t*,MyTraits> *)&this->framequeue,
                         &this->replacetoken,&local_30);
    } while (bVar1);
  }
  zloop_reader(loop,(this->super_HighFreqSub).sub,bufferwriter,this);
  zloop_reader(loop,this->rep,requesthandler,this);
  return;
}

Assistant:

void HFSubConsumer::sub_reader(zloop_t *loop){
    zframe_t *f;
    while(framequeue.try_dequeue(replacetoken, f)){
        zframe_destroy(&f);
        f = NULL;
    }
    zloop_reader(loop, sub, bufferwriter, this);
    zloop_reader(loop, rep, requesthandler, this);
}